

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_backend.cpp
# Opt level: O3

void __thiscall
booster::locale::impl_posix::posix_localization_backend::posix_localization_backend
          (posix_localization_backend *this,posix_localization_backend *other)

{
  pointer pcVar1;
  
  (this->super_localization_backend)._vptr_localization_backend =
       (_func_int **)&PTR__posix_localization_backend_001d1ca0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->paths_,&other->paths_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->domains_,&other->domains_);
  (this->locale_id_)._M_dataplus._M_p = (pointer)&(this->locale_id_).field_2;
  pcVar1 = (other->locale_id_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->locale_id_,pcVar1,pcVar1 + (other->locale_id_)._M_string_length);
  (this->real_id_)._M_dataplus._M_p = (pointer)&(this->real_id_).field_2;
  (this->real_id_)._M_string_length = 0;
  (this->real_id_).field_2._M_local_buf[0] = '\0';
  this->invalid_ = true;
  (this->lc_).super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->lc_).super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

posix_localization_backend(posix_localization_backend const &other) : 
            localization_backend(),
            paths_(other.paths_),
            domains_(other.domains_),
            locale_id_(other.locale_id_),
            invalid_(true)
        {
        }